

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
geemuboi::test::core::CpuTest_add_hl_hl_Test::~CpuTest_add_hl_hl_Test(CpuTest_add_hl_hl_Test *this)

{
  CpuTest_add_hl_hl_Test *this_local;
  
  CpuTest::~CpuTest(&this->super_CpuTest);
  return;
}

Assistant:

TEST_F(CpuTest, add_hl_hl) {
    regs.f = ICpu::Z_FLAG;
    regs.h = 1;
    regs.l = 2;
    execute_instruction(0x29);

    ICpu::Registers expected_regs{};
    expected_regs.h = 2;
    expected_regs.l = 4;
    expected_regs.f = ICpu::Z_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}